

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall RealCommandRunner::CanRunMore(RealCommandRunner *this)

{
  pointer ppSVar1;
  pointer ppSVar2;
  bool bVar3;
  size_type sVar4;
  double dVar5;
  
  if ((this->tokens_ == (TokenPool *)0x0) &&
     (ppSVar1 = (this->subprocs_).running_.
                super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
                super__Vector_impl_data._M_finish,
     ppSVar2 = (this->subprocs_).running_.
               super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
               super__Vector_impl_data._M_start,
     sVar4 = std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>::size
                       (&(this->subprocs_).finished_.c),
     *(int *)(this->config_ + 8) <= (int)sVar4 + (int)((ulong)((long)ppSVar1 - (long)ppSVar2) >> 3))
     ) {
    return false;
  }
  bVar3 = true;
  if (((this->subprocs_).running_.super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
       _M_impl.super__Vector_impl_data._M_start !=
       (this->subprocs_).running_.super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
       _M_impl.super__Vector_impl_data._M_finish) && (0.0 < this->max_load_average_)) {
    dVar5 = GetLoadAverage();
    bVar3 = dVar5 < this->max_load_average_;
  }
  return bVar3;
}

Assistant:

bool RealCommandRunner::CanRunMore() const {
  bool parallelism_limit_not_reached =
    tokens_ || // ignore config_.parallelism
    ((int) (subprocs_.running_.size() +
            subprocs_.finished_.size()) < config_.parallelism);
  return parallelism_limit_not_reached
    && (subprocs_.running_.empty() ||
        (max_load_average_ <= 0.0f ||
         GetLoadAverage() < max_load_average_));
}